

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv_shutdown(uv_shutdown_t *req,uv_stream_t *stream,uv_shutdown_cb cb)

{
  uv_shutdown_cb cb_local;
  uv_stream_t *stream_local;
  uv_shutdown_t *req_local;
  
  if ((stream->type != UV_TCP) && (stream->type != UV_NAMED_PIPE)) {
    __assert_fail("(stream->type == UV_TCP || stream->type == UV_NAMED_PIPE) && \"uv_shutdown (unix) only supports uv_handle_t right now\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x4e5,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
  }
  if (((stream->flags & 0x40) == 0) ||
     ((((stream->flags & 0x10) != 0 || ((stream->flags & 8) != 0)) || ((stream->flags & 3) != 0))))
  {
    req_local._4_4_ = -0x6b;
  }
  else {
    if ((stream->io_watcher).fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x4ee,"int uv_shutdown(uv_shutdown_t *, uv_stream_t *, uv_shutdown_cb)");
    }
    req->type = UV_SHUTDOWN;
    req->active_queue[0] = stream->loop->active_reqs;
    req->active_queue[1] = stream->loop->active_reqs[1];
    *(void ***)req->active_queue[1] = req->active_queue;
    stream->loop->active_reqs[1] = req->active_queue;
    req->handle = stream;
    req->cb = cb;
    stream->shutdown_req = req;
    stream->flags = stream->flags | 8;
    uv__io_start(stream->loop,&stream->io_watcher,4);
    uv__stream_osx_interrupt_select(stream);
    req_local._4_4_ = 0;
  }
  return req_local._4_4_;
}

Assistant:

int uv_shutdown(uv_shutdown_t* req, uv_stream_t* stream, uv_shutdown_cb cb) {
  assert((stream->type == UV_TCP || stream->type == UV_NAMED_PIPE) &&
         "uv_shutdown (unix) only supports uv_handle_t right now");

  if (!(stream->flags & UV_STREAM_WRITABLE) ||
      stream->flags & UV_STREAM_SHUT ||
      stream->flags & UV_STREAM_SHUTTING ||
      uv__is_closing(stream)) {
    return -ENOTCONN;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Initialize request */
  uv__req_init(stream->loop, req, UV_SHUTDOWN);
  req->handle = stream;
  req->cb = cb;
  stream->shutdown_req = req;
  stream->flags |= UV_STREAM_SHUTTING;

  uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);

  return 0;
}